

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrCnf.c
# Opt level: O0

int Pdr_ObjRegNum(Pdr_Man_t *p,int k,int iSatVar)

{
  int iSatVar_local;
  int k_local;
  Pdr_Man_t *p_local;
  
  if (p->pPars->fMonoCnf == 0) {
    p_local._4_4_ = Pdr_ObjRegNum2(p,k,iSatVar);
  }
  else {
    p_local._4_4_ = Pdr_ObjRegNum1(p,k,iSatVar);
  }
  return p_local._4_4_;
}

Assistant:

int Pdr_ObjRegNum( Pdr_Man_t * p, int k, int iSatVar )
{
    if ( p->pPars->fMonoCnf )
        return Pdr_ObjRegNum1( p, k, iSatVar );
    else
        return Pdr_ObjRegNum2( p, k, iSatVar );
}